

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handoff.cc
# Opt level: O1

int SSL_request_handshake_hints
              (SSL *ssl,uint8_t *client_hello,size_t client_hello_len,uint8_t *capabilities,
              size_t capabilities_len)

{
  undefined1 *puVar1;
  SSL3_STATE *pSVar2;
  BUF_MEM *buf;
  _Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false> __p;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  BUF_MEM *__p_00;
  UniquePtr<SSL_HANDSHAKE_HINTS> hints;
  Array<unsigned_char> client_hello_msg;
  CBS cbs;
  CBS seq;
  ScopedCBB client_hello_cbb;
  CBB client_hello_body;
  _Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false> local_c0;
  Array<unsigned_char> local_b8;
  CBS local_a8;
  CBS local_98;
  CBB local_88;
  CBB local_58;
  
  iVar4 = SSL_is_dtls(ssl);
  if (iVar4 == 0) {
    local_a8.data = capabilities;
    local_a8.len = capabilities_len;
    local_c0._M_head_impl = (SSL_HANDSHAKE_HINTS *)OPENSSL_malloc(0xf8);
    if (local_c0._M_head_impl == (pointer)0x0) {
      local_c0._M_head_impl = (pointer)0x0;
    }
    else {
      memset(local_c0._M_head_impl,0,0xf8);
    }
    iVar4 = 0;
    if (local_c0._M_head_impl != (pointer)0x0) {
      iVar5 = CBS_get_asn1(&local_a8,&local_98,0x20000010);
      iVar4 = 0;
      if (iVar5 != 0) {
        bVar3 = bssl::apply_remote_features(ssl,&local_98);
        if (bVar3) {
          pSVar2 = ssl->s3;
          *(ushort *)&pSVar2->field_0xdc = *(ushort *)&pSVar2->field_0xdc | 10;
          local_b8.data_ = (uchar *)0x0;
          local_b8.size_ = 0;
          CBB_zero(&local_88);
          bVar3 = (*ssl->method->init_message)(ssl,&local_88,&local_58,'\x01');
          iVar5 = 0;
          iVar4 = 0;
          if (bVar3) {
            iVar6 = CBB_add_bytes(&local_58,client_hello,client_hello_len);
            iVar4 = iVar5;
            if (iVar6 != 0) {
              bVar3 = (*ssl->method->finish_message)(ssl,&local_88,&local_b8);
              if (bVar3) {
                __p_00 = BUF_MEM_new();
                std::__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>::reset
                          ((__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter> *)&pSVar2->hs_buf,
                           (pointer)__p_00);
                buf = (pSVar2->hs_buf)._M_t.
                      super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
                if (buf != (BUF_MEM *)0x0) {
                  iVar5 = BUF_MEM_append(buf,local_b8.data_,local_b8.size_);
                  __p._M_head_impl = local_c0._M_head_impl;
                  if (iVar5 != 0) {
                    puVar1 = &((pSVar2->hs)._M_t.
                               super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>.
                               _M_t.
                               super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>
                               .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl)->
                              field_0x6c8;
                    *(uint *)puVar1 = *(uint *)puVar1 | 0x100000;
                    local_c0._M_head_impl = (pointer)0x0;
                    std::__uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::reset
                              ((__uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                                *)&((pSVar2->hs)._M_t.
                                    super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>.
                                   _M_head_impl)->hints,__p._M_head_impl);
                    iVar4 = 1;
                  }
                }
              }
            }
          }
          CBB_cleanup(&local_88);
          OPENSSL_free(local_b8.data_);
        }
      }
    }
    std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter> *)&local_c0);
  }
  else {
    iVar4 = 0;
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                  ,0x318);
  }
  return iVar4;
}

Assistant:

int SSL_request_handshake_hints(SSL *ssl, const uint8_t *client_hello,
                                size_t client_hello_len,
                                const uint8_t *capabilities,
                                size_t capabilities_len) {
  if (SSL_is_dtls(ssl)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  CBS cbs, seq;
  CBS_init(&cbs, capabilities, capabilities_len);
  UniquePtr<SSL_HANDSHAKE_HINTS> hints = MakeUnique<SSL_HANDSHAKE_HINTS>();
  if (hints == nullptr ||                              //
      !CBS_get_asn1(&cbs, &seq, CBS_ASN1_SEQUENCE) ||  //
      !apply_remote_features(ssl, &seq)) {
    return 0;
  }

  SSL3_STATE *const s3 = ssl->s3;
  s3->v2_hello_done = true;
  s3->has_message = true;

  Array<uint8_t> client_hello_msg;
  ScopedCBB client_hello_cbb;
  CBB client_hello_body;
  if (!ssl->method->init_message(ssl, client_hello_cbb.get(),
                                 &client_hello_body, SSL3_MT_CLIENT_HELLO) ||
      !CBB_add_bytes(&client_hello_body, client_hello, client_hello_len) ||
      !ssl->method->finish_message(ssl, client_hello_cbb.get(),
                                   &client_hello_msg)) {
    return 0;
  }

  s3->hs_buf.reset(BUF_MEM_new());
  if (!s3->hs_buf || !BUF_MEM_append(s3->hs_buf.get(), client_hello_msg.data(),
                                     client_hello_msg.size())) {
    return 0;
  }

  s3->hs->hints_requested = true;
  s3->hs->hints = std::move(hints);
  return 1;
}